

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state duckdb_appender_clear_columns(duckdb_appender appender)

{
  type pAVar1;
  duckdb_state dVar2;
  ErrorData error;
  
  dVar2 = DuckDBError;
  if ((appender != (duckdb_appender)0x0) && (*(long *)appender != 0)) {
    pAVar1 = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
             operator*((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                       appender);
    dVar2 = DuckDBSuccess;
    (*(pAVar1->super_BaseAppender)._vptr_BaseAppender[3])(pAVar1);
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_appender_clear_columns(duckdb_appender appender) {
	return duckdb_appender_run_function(appender, [&](Appender &appender) { appender.ClearColumns(); });
}